

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkFor
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeFor *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeFor *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        pnode->pnodeInit,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,local_21);
  if (bVar1) {
    local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                         ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                          (ParseNode *)pnode,pnode->pnodeCond,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_21);
    if (bVar1) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            (ParseNode *)pnode,pnode->pnodeIncr,context);
      bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                        (&this->super_WalkerPolicyTest,local_21);
      if (bVar1) {
        local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                             ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                              (ParseNode *)pnode,context);
        bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                          (&this->super_WalkerPolicyTest,local_21);
        if (bVar1) {
          local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                               ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                                pnode->pnodeBody,context);
        }
      }
    }
  }
  return local_21;
}

Assistant:

ResultType WalkFor(ParseNodeFor *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnodeInit, context);
        if (ContinueWalk(result))
        {
            result = WalkNthChild(pnode, pnode->pnodeCond, context);
            if (ContinueWalk(result))
            {
                result = WalkNthChild(pnode, pnode->pnodeIncr, context);
                if (ContinueWalk(result))
                {
                    result = WalkNode(pnode, context);
                    if (ContinueWalk(result))
                    {
                        result = WalkSecondChild(pnode->pnodeBody, context);
                    }
                }
            }
        }
        return result;
    }